

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::TestCallHandler::encode
          (TestCallHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader value;
  Builder params;
  Builder call;
  StructBuilder local_b0;
  ListBuilder local_88;
  PointerBuilder local_60;
  StructBuilder local_48;
  
  *(undefined2 *)output._builder.data = 6;
  local_88.segment = output._builder.segment;
  local_88.capTable = output._builder.capTable;
  local_88.ptr = (byte *)output._builder.pointers;
  PointerBuilder::initStruct(&local_48,(PointerBuilder *)&local_88,(StructSize)0x20000);
  local_88.segment = local_48.segment;
  local_88.capTable = local_48.capTable;
  local_88.ptr = (byte *)local_48.pointers;
  value.super_StringPtr.content.size_ = 5;
  value.super_StringPtr.content.ptr = "Frob";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_88,value);
  local_b0.data = local_48.pointers + 1;
  local_b0.segment = local_48.segment;
  local_b0.capTable = local_48.capTable;
  PointerBuilder::initStructList(&local_88,(PointerBuilder *)&local_b0,2,(StructSize)0x10002);
  ListBuilder::getStructElement(&local_b0,&local_88,0);
  *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_b0.data)->value = 2;
  ((WirePointer *)((long)local_b0.data + 8))->offsetAndKind = 0;
  ((WirePointer *)((long)local_b0.data + 8))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x405ec000;
  ListBuilder::getStructElement(&local_b0,&local_88,1);
  *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_b0.data)->value = 3;
  local_60.segment = local_b0.segment;
  local_60.capTable = local_b0.capTable;
  local_60.pointer = local_b0.pointers;
  PointerBuilder::setBlob<capnp::Text>(&local_60,input);
  return;
}

Assistant:

void encode(const JsonCodec& codec, Text::Reader input,
              JsonValue::Builder output) const override {
    auto call = output.initCall();
    call.setFunction("Frob");
    auto params = call.initParams(2);
    params[0].setNumber(123);
    params[1].setString(input);
  }